

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readCStyleComment(Reader *this)

{
  Char CVar1;
  Char c;
  Reader *this_local;
  
  do {
    if (this->current_ == this->end_) break;
    CVar1 = getNextChar(this);
  } while ((CVar1 != '*') || (*this->current_ != '/'));
  CVar1 = getNextChar(this);
  return CVar1 == '/';
}

Assistant:

bool
Reader::readCStyleComment ()
{
    while ( current_ != end_ )
    {
        Char c = getNextChar ();

        if ( c == '*'  &&  *current_ == '/' )
            break;
    }

    return getNextChar () == '/';
}